

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall duckdb::Appender::AddColumn(Appender *this,string *name)

{
  unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true> *this_00
  ;
  size_t __n;
  pointer pLVar1;
  iterator __position;
  Allocator *allocator_p;
  bool bVar2;
  int iVar3;
  pointer pTVar4;
  reference this_01;
  string *psVar5;
  InvalidInputException *pIVar6;
  LogicalIndex LVar7;
  LogicalType *__x;
  ColumnDataCollection *this_02;
  size_type __n_00;
  pointer pLVar8;
  vector<duckdb::LogicalType,_true> *this_03;
  string local_50;
  
  BaseAppender::Flush(&this->super_BaseAppender);
  this_00 = &this->description;
  pTVar4 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
           ::operator->(this_00);
  if ((pTVar4->columns).
      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (pTVar4->columns).
      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    __n_00 = 0;
    do {
      pTVar4 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
               ::operator->(this_00);
      this_01 = vector<duckdb::ColumnDefinition,_true>::operator[](&pTVar4->columns,__n_00);
      psVar5 = ColumnDefinition::Name_abi_cxx11_(this_01);
      __n = psVar5->_M_string_length;
      if (__n == name->_M_string_length) {
        if (__n == 0) {
LAB_01647b33:
          bVar2 = ColumnDefinition::Generated(this_01);
          if (bVar2) {
            pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"cannot add a generated column to the appender","");
            InvalidInputException::InvalidInputException(pIVar6,&local_50);
            __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
          pLVar8 = (this->column_ids).
                   super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                   super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pLVar1 = (this->column_ids).
                   super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                   super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          while( true ) {
            if (pLVar8 == pLVar1) {
              this_03 = &(this->super_BaseAppender).active_types;
              __x = ColumnDefinition::Type(this_01);
              ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                        ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                         this_03,__x);
              local_50._M_dataplus._M_p = (pointer)ColumnDefinition::Logical(this_01);
              __position._M_current =
                   (this->column_ids).
                   super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                   super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->column_ids).
                  super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                  super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>::
                _M_realloc_insert<duckdb::LogicalIndex>
                          (&(this->column_ids).
                            super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>
                           ,__position,(LogicalIndex *)&local_50);
              }
              else {
                (__position._M_current)->index = (idx_t)local_50._M_dataplus._M_p;
                (this->column_ids).
                super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
              BaseAppender::InitializeChunk(&this->super_BaseAppender);
              allocator_p = (this->super_BaseAppender).allocator;
              if ((this->super_BaseAppender).active_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start ==
                  (this->super_BaseAppender).active_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                this_03 = &(this->super_BaseAppender).types;
              }
              this_02 = (ColumnDataCollection *)operator_new(0x70);
              ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                        ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                         &local_50,
                         &this_03->
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
              ColumnDataCollection::ColumnDataCollection
                        (this_02,allocator_p,(vector<duckdb::LogicalType,_true> *)&local_50);
              ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                        ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                         &local_50);
              ::std::
              __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
              ::reset((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                       *)&(this->super_BaseAppender).collection,this_02);
              return;
            }
            LVar7 = ColumnDefinition::Logical(this_01);
            if (pLVar8->index == LVar7.index) break;
            pLVar8 = pLVar8 + 1;
          }
          pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"cannot add the same column twice","");
          InvalidInputException::InvalidInputException(pIVar6,&local_50);
          __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
        }
        iVar3 = bcmp((psVar5->_M_dataplus)._M_p,(name->_M_dataplus)._M_p,__n);
        if (iVar3 == 0) goto LAB_01647b33;
      }
      __n_00 = __n_00 + 1;
      pTVar4 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
               ::operator->(this_00);
    } while (__n_00 < (ulong)(((long)(pTVar4->columns).
                                     super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                     .
                                     super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pTVar4->columns).
                                     super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                     .
                                     super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x7b425ed097b425ed));
  }
  pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"the column must exist in the table","");
  InvalidInputException::InvalidInputException(pIVar6,&local_50);
  __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Appender::AddColumn(const string &name) {
	Flush();

	auto exists = false;
	for (idx_t col_idx = 0; col_idx < description->columns.size(); col_idx++) {
		auto &col_def = description->columns[col_idx];
		if (col_def.Name() != name) {
			continue;
		}

		// Ensure that we are not adding a generated column.
		if (col_def.Generated()) {
			throw InvalidInputException("cannot add a generated column to the appender");
		}

		// Ensure that we haven't added this column before.
		for (const auto &column_id : column_ids) {
			if (column_id == col_def.Logical()) {
				throw InvalidInputException("cannot add the same column twice");
			}
		}

		active_types.push_back(col_def.Type());
		column_ids.push_back(col_def.Logical());
		exists = true;
		break;
	}
	if (!exists) {
		throw InvalidInputException("the column must exist in the table");
	}

	InitializeChunk();
	collection = make_uniq<ColumnDataCollection>(allocator, GetActiveTypes());
}